

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

Formula * __thiscall
Kernel::PolarityAwareFormulaTransformer::transformWithPolarity
          (PolarityAwareFormulaTransformer *this,Formula *f,int polarity)

{
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  Formula *pFVar1;
  undefined4 in_EDX;
  Formula *in_RSI;
  FormulaTransformer *in_RDI;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_00000028;
  Formula *in_stack_00000030;
  
  this_00 = Lib::
            Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x8591f5);
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset(this_00);
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x859214);
  SortHelper::collectVariableSorts(in_stack_00000030,in_stack_00000028,this._7_1_);
  *(undefined4 *)&in_RDI[3]._vptr_FormulaTransformer = in_EDX;
  pFVar1 = FormulaTransformer::transform(in_RDI,in_RSI);
  return pFVar1;
}

Assistant:

Formula* PolarityAwareFormulaTransformer::transformWithPolarity(Formula* f, int polarity)
{
  ASS_REP(polarity==0 || polarity==1 || polarity==-1, polarity);

  _varSorts->reset();
  SortHelper::collectVariableSorts(f, *_varSorts);

  _polarity = polarity;
  return FormulaTransformer::transform(f);
}